

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDCpp14.h
# Opt level: O2

_Unknown_bound __thiscall mmd::make_unique<pmx::PmxMorphGroupOffset[]>(mmd *this,size_t n)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  
  puVar1 = (undefined8 *)operator_new__(-(ulong)(n >> 0x3c != 0) | n * 0x10);
  if (n != 0) {
    puVar2 = puVar1;
    do {
      *puVar2 = &PTR_Read_0082ce40;
      puVar2[1] = 0;
      puVar2 = puVar2 + 2;
    } while (puVar2 != puVar1 + n * 2);
  }
  *(undefined8 **)this = puVar1;
  return (__uniq_ptr_data<pmx::PmxMorphGroupOffset,_std::default_delete<pmx::PmxMorphGroupOffset[]>,_true,_true>
          )(__uniq_ptr_data<pmx::PmxMorphGroupOffset,_std::default_delete<pmx::PmxMorphGroupOffset[]>,_true,_true>
            )this;
}

Assistant:

typename _Unique_if<T>::_Unknown_bound
        make_unique(size_t n) {
            typedef typename std::remove_extent<T>::type U;
            return std::unique_ptr<T>(new U[n]());
        }